

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::EnsureDirectoryExists(cmNinjaTargetGenerator *this,string *path)

{
  bool bVar1;
  cmGlobalNinjaGenerator *this_00;
  string *psVar2;
  string fullPath;
  string sStack_38;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath(path);
  if (bVar1) {
    cmsys::SystemTools::MakeDirectory(path,(mode_t *)0x0);
    return;
  }
  this_00 = GetGlobalGenerator(this);
  psVar2 = cmake::GetHomeOutputDirectory_abi_cxx11_
                     ((this_00->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance
                     );
  std::__cxx11::string::string((string *)&sStack_38,(string *)psVar2);
  cmGlobalNinjaGenerator::StripNinjaOutputPathPrefixAsSuffix(this_00,&sStack_38);
  std::__cxx11::string::append((string *)&sStack_38);
  cmsys::SystemTools::MakeDirectory(&sStack_38,(mode_t *)0x0);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void cmNinjaTargetGenerator::EnsureDirectoryExists(
  const std::string& path) const
{
  if (cmSystemTools::FileIsFullPath(path)) {
    cmSystemTools::MakeDirectory(path);
  } else {
    cmGlobalNinjaGenerator* gg = this->GetGlobalGenerator();
    std::string fullPath = gg->GetCMakeInstance()->GetHomeOutputDirectory();
    // Also ensures their is a trailing slash.
    gg->StripNinjaOutputPathPrefixAsSuffix(fullPath);
    fullPath += path;
    cmSystemTools::MakeDirectory(fullPath);
  }
}